

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O1

void __thiscall deqp::SubcaseBase::Documentation(SubcaseBase *this)

{
  TestLog *log;
  string vsh2;
  string vsh;
  string gsh2;
  string gsh;
  string tesh2;
  string tesh;
  string tcsh2;
  string tcsh;
  string fsh;
  string fsh2;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150 [9];
  
  log = ((this->super_GLWrapper).m_context)->m_testCtx->m_log;
  (*(this->super_GLWrapper)._vptr_GLWrapper[5])(local_150,this);
  WriteField(log,"Title",local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150[0]._M_dataplus._M_p != &local_150[0].field_2) {
    operator_delete(local_150[0]._M_dataplus._M_p,local_150[0].field_2._M_allocated_capacity + 1);
  }
  (*(this->super_GLWrapper)._vptr_GLWrapper[6])(&local_170,this);
  WriteField(log,"Purpose",&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_GLWrapper)._vptr_GLWrapper[7])(&local_190,this);
  WriteField(log,"Method",&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_GLWrapper)._vptr_GLWrapper[8])(&local_1b0,this);
  WriteField(log,"Pass Criteria",&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SubcaseBase::Documentation()
{
	using namespace std;
	using tcu::TestLog;
	TestLog& log = m_context.getTestContext().getLog();

	WriteField(log, "Title", Title());
	WriteField(log, "Purpose", Purpose());
	WriteField(log, "Method", Method());
	WriteField(log, "Pass Criteria", PassCriteria());

	//OpenGL fields
	string vsh = VertexShader();
	if (!vsh.empty())
		WriteField(log, "OpenGL vertex shader", vsh);

	string vsh2 = VertexShader2();
	if (!vsh2.empty())
		WriteField(log, "OpenGL vertex shader 2", vsh2);

	string tcsh = TessControlShader();
	if (!tcsh.empty())
		WriteField(log, "OpenGL tessellation control shader", tcsh);

	string tcsh2 = TessControlShader();
	if (!tcsh2.empty())
		WriteField(log, "OpenGL tessellation control shader 2", tcsh2);

	string tesh = TessControlShader();
	if (!tesh.empty())
		WriteField(log, "OpenGL tessellation evaluation shader", tesh);

	string tesh2 = TessControlShader();
	if (!tesh2.empty())
		WriteField(log, "OpenGL tessellation evaluation shader 2", tesh2);

	string gsh = GeometryShader();
	if (!gsh.empty())
		WriteField(log, "OpenGL geometry shader", gsh);

	string gsh2 = GeometryShader2();
	if (!gsh2.empty())
		WriteField(log, "OpenGL geometry shader 2", gsh2);

	string fsh = FragmentShader();
	if (!fsh.empty())
		WriteField(log, "OpenGL fragment shader", fsh);

	string fsh2 = FragmentShader2();
	if (!fsh2.empty())
		WriteField(log, "OpenGL fragment shader 2", fsh2);
}